

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

KINT32 __thiscall KDIS::NETWORK::Connection::Send(Connection *this,KOCTET *Data,KUINT32 DataSz)

{
  ssize_t sVar1;
  KException *this_00;
  int *piVar2;
  KCHAR8 *__s;
  Connection *this_01;
  allocator<char> local_39;
  KString local_38;
  
  sVar1 = sendto(this->m_iSocket[0],Data,(ulong)DataSz,0,(sockaddr *)&this->m_SendToAddr,0x10);
  if ((int)sVar1 != -1) {
    return (int)sVar1;
  }
  this_01 = (Connection *)0x30;
  this_00 = (KException *)__cxa_allocate_exception();
  piVar2 = __errno_location();
  __s = getErrorText(this_01,*piVar2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  KException::KException(this_00,&local_38,0xc);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

KINT32 Connection::Send(const KOCTET *Data, KUINT32 DataSz) noexcept(false)
{
    KINT32 iBytesSent =  sendto( m_iSocket[SEND_SOCK], Data, DataSz, 0, ( sockaddr * )&m_SendToAddr, sizeof( m_SendToAddr ) );

    if( iBytesSent == SOCKET_ERROR )
    {
        THROW_ERROR;
    }

    return iBytesSent;
}